

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

LArYieldResult * __thiscall
NEST::LArNEST::GetdEdxYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double energy,double dx,
          double efield,double density)

{
  double exciton_yields;
  double ionization_yields;
  LArYieldResult result;
  double density_local;
  double efield_local;
  double dx_local;
  double energy_local;
  LArNEST *this_local;
  
  exciton_yields = GetCanonicalIonizationYields(this,energy);
  if (exciton_yields < 0.0) {
    exciton_yields = 0.0;
  }
  GetdEdxRecombinationYields
            (__return_storage_ptr__,this,exciton_yields,this->fNexOverNion * exciton_yields,energy,
             dx,efield);
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::GetdEdxYields(double energy, double dx, double efield,
                                      double density) {
  LArYieldResult result;
  double ionization_yields = GetCanonicalIonizationYields(energy);
  if (ionization_yields < 0.0) {
    ionization_yields = 0.0;
  }
  double exciton_yields = fNexOverNion * ionization_yields;
  return GetdEdxRecombinationYields(ionization_yields, exciton_yields, energy,
                                    dx, efield);
}